

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O3

void __thiscall
binlog::PrettyPrinter::printEventField
          (PrettyPrinter *this,OstreamBuffer *out,char spec,Event *event,WriterProp *writerProp)

{
  char cVar1;
  Severity SVar2;
  size_type sVar3;
  uint uVar4;
  undefined8 in_RAX;
  uint uVar5;
  Event *pEVar6;
  undefined7 in_register_00000011;
  void *__buf;
  int iVar7;
  pointer pcVar8;
  uint64_t v;
  uint5 local_18;
  undefined3 uStack_13;
  
  iVar7 = (int)CONCAT71(in_register_00000011,spec);
  if (99 < iVar7) {
    switch(iVar7) {
    case 0x6d:
      printEventMessage(this,out,event);
      return;
    case 0x6e:
      iVar7 = (int)(writerProp->name)._M_dataplus._M_p;
      __buf = (void *)(writerProp->name)._M_string_length;
      goto LAB_001b1dce;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
      break;
    case 0x72:
      v = event->clockValue;
      goto LAB_001b1dec;
    case 0x74:
      v = writerProp->id;
      goto LAB_001b1dec;
    case 0x75:
      printUTCTime(this,out,event->clockValue);
      return;
    default:
      if (iVar7 == 100) {
        printProducerLocalTime(this,out,event->clockValue);
        return;
      }
    }
    goto switchD_001b1c64_caseD_44;
  }
  switch(iVar7) {
  case 0x43:
    iVar7 = (int)(event->source->category)._M_dataplus._M_p;
    __buf = (void *)(event->source->category)._M_string_length;
    break;
  case 0x46:
    iVar7 = (int)(event->source->file)._M_dataplus._M_p;
    __buf = (void *)(event->source->file)._M_string_length;
    break;
  case 0x47:
    sVar3 = (event->source->file)._M_string_length;
    pcVar8 = (event->source->file)._M_dataplus._M_p + sVar3;
    event = (Event *)0x0;
    do {
      pEVar6 = event;
      event = pEVar6;
      if ((-(long)pEVar6 == sVar3) || (cVar1 = (pcVar8 + -1)[(long)pEVar6], cVar1 == '\\')) break;
      event = (Event *)((long)&pEVar6[-1].arguments._end + 7);
    } while (cVar1 != '/');
    iVar7 = (int)pcVar8 + (int)pEVar6;
    __buf = (void *)-(long)pEVar6;
    break;
  case 0x49:
    v = event->source->id;
    goto LAB_001b1dec;
  case 0x4c:
    v = event->source->line;
LAB_001b1dec:
    detail::OstreamBuffer::writeUnsigned(out,v);
    return;
  case 0x4d:
    iVar7 = (int)(event->source->function)._M_dataplus._M_p;
    __buf = (void *)(event->source->function)._M_string_length;
    break;
  case 0x50:
    iVar7 = (int)(event->source->formatString)._M_dataplus._M_p;
    __buf = (void *)(event->source->formatString)._M_string_length;
    break;
  case 0x53:
    SVar2 = event->source->severity;
    if (SVar2 < warning) {
      if (SVar2 == trace) {
        uVar4 = 0x54;
        uVar5 = 0x43415200;
        goto LAB_001b1e6c;
      }
      if (SVar2 == debug) {
        uVar4 = 0x44;
        uVar5 = 0x47424500;
        goto LAB_001b1e6c;
      }
      if (SVar2 == info) {
        uVar4 = 0x49;
        uVar5 = 0x4f464e00;
        goto LAB_001b1e6c;
      }
    }
    else if (SVar2 < critical) {
      if (SVar2 == warning) {
        uVar4 = 0x57;
        uVar5 = 0x4e524100;
        goto LAB_001b1e6c;
      }
      if (SVar2 == error) {
        uVar4 = 0x45;
        uVar5 = 0x4f525200;
        goto LAB_001b1e6c;
      }
    }
    else {
      if (SVar2 == critical) {
        uVar4 = 0x43;
        uVar5 = 0x54495200;
        goto LAB_001b1e6c;
      }
      if (SVar2 == no_logs) {
        uVar4 = 0x4e;
        uVar5 = 0x474c4f00;
        goto LAB_001b1e6c;
      }
    }
    uVar4 = 0x55;
    uVar5 = 0x574b4e00;
LAB_001b1e6c:
    uStack_13 = (undefined3)((ulong)in_RAX >> 0x28);
    local_18 = (uint5)(uVar5 | uVar4);
    detail::OstreamBuffer::write(out,(int)&local_18,(void *)0x4,(ulong)(uVar5 | uVar4));
    return;
  case 0x54:
    iVar7 = (int)(event->source->argumentTags)._M_dataplus._M_p;
    __buf = (void *)(event->source->argumentTags)._M_string_length;
    break;
  default:
    if (iVar7 == 0x25) {
      spec = '%';
      goto LAB_001b1cde;
    }
  case 0x44:
  case 0x45:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4e:
  case 0x4f:
  case 0x51:
  case 0x52:
switchD_001b1c64_caseD_44:
    detail::OstreamBuffer::put(out,'%');
LAB_001b1cde:
    detail::OstreamBuffer::put(out,spec);
    return;
  }
LAB_001b1dce:
  detail::OstreamBuffer::write(out,iVar7,__buf,(size_t)event);
  return;
}

Assistant:

void PrettyPrinter::printEventField(
  detail::OstreamBuffer& out,
  char spec,
  const Event& event,
  const WriterProp& writerProp
) const
{
  switch (spec)
  {
  case 'I':
    out << event.source->id;
    break;
  case 'S':
    out << severityToString(event.source->severity);
    break;
  case 'C':
    out << event.source->category;
    break;
  case 'M':
    out << event.source->function;
    break;
  case 'F':
    out << event.source->file;
    break;
  case 'G':
    printFilename(out, event.source->file);
    break;
  case 'L':
    out << event.source->line;
    break;
  case 'P':
    out << event.source->formatString;
    break;
  case 'T':
    out << event.source->argumentTags;
    break;
  case 'n':
    out << writerProp.name;
    break;
  case 't':
    out << writerProp.id;
    break;
  case 'd':
    printProducerLocalTime(out, event.clockValue);
    break;
  case 'u':
    printUTCTime(out, event.clockValue);
    break;
  case 'r':
    out << event.clockValue;
    break;
  case 'm':
    printEventMessage(out, event);
    break;
  case '%':
    out.put('%');
    break;
  default:
    out << '%' << spec;
    break;
  }
}